

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash64.cpp
# Opt level: O0

void MetroHash64::Hash(uint8_t *buffer,uint64_t length,uint8_t *hash,uint64_t seed)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long in_RCX;
  ulong *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t v1;
  uint64_t v0;
  uint64_t v [4];
  uint64_t h;
  uint8_t *end;
  uint8_t *ptr;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  void *local_28;
  
  local_38 = (in_RCX + 0x62992fc1) * 0xd6d018f5;
  local_58 = local_38;
  local_50 = local_38;
  local_48 = local_38;
  local_40 = local_38;
  local_28 = in_RDI;
  if (0x1f < in_RSI) {
    do {
      uVar1 = read_u64(local_28);
      uVar1 = rotate_right(uVar1 * 0xd6d018f5 + local_58,0x1d);
      local_58 = uVar1 + local_48;
      uVar1 = read_u64((void *)((long)local_28 + 8));
      uVar1 = rotate_right(uVar1 * 0xa2aa033b + local_50,0x1d);
      local_50 = uVar1 + local_40;
      uVar1 = read_u64((void *)((long)local_28 + 0x10));
      uVar1 = rotate_right(uVar1 * 0x62992fc1 + local_48,0x1d);
      uVar2 = read_u64((void *)((long)local_28 + 0x18));
      local_28 = (void *)((long)local_28 + 0x20);
      uVar2 = rotate_right(uVar2 * 0x30bc5b29 + local_40,0x1d);
      local_40 = uVar2 + local_50;
      local_48 = uVar1 + local_58;
    } while (local_28 <= (void *)((long)in_RDI + (in_RSI - 0x20)));
    uVar2 = rotate_right((local_58 + local_40) * 0xd6d018f5 + local_50,0x25);
    uVar3 = uVar2 * 0xa2aa033b ^ uVar1 + local_58;
    uVar1 = rotate_right((local_50 + uVar3) * 0xa2aa033b + local_58,0x25);
    local_40 = uVar1 * 0xd6d018f5 ^ local_40;
    uVar1 = rotate_right((local_58 + uVar3) * 0xd6d018f5 + local_40,0x25);
    uVar2 = rotate_right((local_50 + local_40) * 0xa2aa033b + uVar3,0x25);
    local_38 = (uVar1 * 0xa2aa033b ^ local_58 ^ uVar2 * 0xd6d018f5 ^ local_50) + local_38;
  }
  if (0xf < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u64(local_28);
    uVar1 = rotate_right(local_38 + uVar1 * 0x62992fc1,0x1d);
    uVar2 = read_u64((void *)((long)local_28 + 8));
    local_28 = (void *)((long)local_28 + 0x10);
    uVar2 = rotate_right(local_38 + uVar2 * 0x62992fc1,0x1d);
    uVar4 = rotate_right(uVar1 * 0x28e511fea41f163d,0x15);
    uVar5 = rotate_right(uVar2 * 0x9472cc564ae2c91,0x15);
    local_38 = (uVar5 + (uVar4 + uVar2 * 0x30bc5b29 ^ uVar1 * 0x30bc5b29) ^ uVar2 * 0x30bc5b29) +
               local_38;
  }
  if (7 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u64(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    local_28 = (void *)((long)local_28 + 8);
    uVar2 = rotate_right(uVar1,0x37);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  if (3 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u32(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    local_28 = (void *)((long)local_28 + 4);
    uVar2 = rotate_right(uVar1,0x1a);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  if (1 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u16(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    local_28 = (void *)((long)local_28 + 2);
    uVar2 = rotate_right(uVar1,0x30);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  if (0 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
    uVar1 = read_u8(local_28);
    uVar1 = uVar1 * 0x30bc5b29 + local_38;
    uVar2 = rotate_right(uVar1,0x25);
    local_38 = uVar2 * 0xa2aa033b ^ uVar1;
  }
  uVar1 = rotate_right(local_38,0x1c);
  uVar1 = (uVar1 ^ local_38) * 0xd6d018f5;
  uVar2 = rotate_right(uVar1,0x1d);
  *in_RDX = uVar2 ^ uVar1;
  return;
}

Assistant:

void MetroHash64::Hash(const uint8_t * buffer, const uint64_t length, uint8_t * const hash, const uint64_t seed)
{
    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(buffer);
    const uint8_t * const end = ptr + length;

    uint64_t h = (static_cast<uint64_t>(seed) + k2) * k0;

    if (length >= 32)
    {
        uint64_t v[4];
        v[0] = h;
        v[1] = h;
        v[2] = h;
        v[3] = h;

        do
        {
            v[0] += read_u64(ptr) * k0; ptr += 8; v[0] = rotate_right(v[0],29) + v[2];
            v[1] += read_u64(ptr) * k1; ptr += 8; v[1] = rotate_right(v[1],29) + v[3];
            v[2] += read_u64(ptr) * k2; ptr += 8; v[2] = rotate_right(v[2],29) + v[0];
            v[3] += read_u64(ptr) * k3; ptr += 8; v[3] = rotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 37) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 37) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 37) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 37) * k0;
        h += v[0] ^ v[1];
    }

    if ((end - ptr) >= 16)
    {
        uint64_t v0 = h + (read_u64(ptr) * k2); ptr += 8; v0 = rotate_right(v0,29) * k3;
        uint64_t v1 = h + (read_u64(ptr) * k2); ptr += 8; v1 = rotate_right(v1,29) * k3;
        v0 ^= rotate_right(v0 * k0, 21) + v1;
        v1 ^= rotate_right(v1 * k3, 21) + v0;
        h += v1;
    }

    if ((end - ptr) >= 8)
    {
        h += read_u64(ptr) * k3; ptr += 8;
        h ^= rotate_right(h, 55) * k1;
    }

    if ((end - ptr) >= 4)
    {
        h += read_u32(ptr) * k3; ptr += 4;
        h ^= rotate_right(h, 26) * k1;
    }

    if ((end - ptr) >= 2)
    {
        h += read_u16(ptr) * k3; ptr += 2;
        h ^= rotate_right(h, 48) * k1;
    }

    if ((end - ptr) >= 1)
    {
        h += read_u8 (ptr) * k3;
        h ^= rotate_right(h, 37) * k1;
    }

    h ^= rotate_right(h, 28);
    h *= k0;
    h ^= rotate_right(h, 29);

    memcpy(hash, &h, 8);
}